

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<ObjectIdentifier>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_48 [7];
  bool fConverted;
  ObjectIdentifier t;
  ostream *os_local;
  AnyType *this_local;
  
  t.oidIndex = (size_t)os;
  ObjectIdentifier::ObjectIdentifier((ObjectIdentifier *)local_48);
  bVar1 = ConvertToType<ObjectIdentifier>(this,(ObjectIdentifier *)local_48);
  if (bVar1) {
    ::operator<<((ostream *)t.oidIndex,(ObjectIdentifier *)local_48);
  }
  ObjectIdentifier::~ObjectIdentifier((ObjectIdentifier *)local_48);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }